

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

int is_smooth(MB_MODE_INFO *mbmi,int plane)

{
  PREDICTION_MODE PVar1;
  bool bVar2;
  
  if (plane == 0) {
    PVar1 = mbmi->mode;
  }
  else {
    if (((mbmi->field_0xa7 & 0x80) != 0) || ('\0' < mbmi->ref_frame[0])) {
      bVar2 = false;
      goto LAB_00337e10;
    }
    PVar1 = mbmi->uv_mode;
  }
  bVar2 = (byte)(PVar1 - 9) < 3;
LAB_00337e10:
  return (int)bVar2;
}

Assistant:

static int is_smooth(const MB_MODE_INFO *mbmi, int plane) {
  if (plane == 0) {
    const PREDICTION_MODE mode = mbmi->mode;
    return (mode == SMOOTH_PRED || mode == SMOOTH_V_PRED ||
            mode == SMOOTH_H_PRED);
  } else {
    // uv_mode is not set for inter blocks, so need to explicitly
    // detect that case.
    if (is_inter_block(mbmi)) return 0;

    const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
    return (uv_mode == UV_SMOOTH_PRED || uv_mode == UV_SMOOTH_V_PRED ||
            uv_mode == UV_SMOOTH_H_PRED);
  }
}